

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::BaseRAPass::blockEntryAssigned(BaseRAPass *this,RAAssignment *as)

{
  uint *puVar1;
  Operand *out;
  PhysToWorkMap *pPVar2;
  uint32_t *puVar3;
  void *pvVar4;
  BaseCompiler *this_00;
  uint32_t uVar5;
  uint uVar6;
  Error EVar7;
  undefined8 extraout_RAX;
  uint alignment;
  uint32_t size;
  uint32_t uVar8;
  uint uVar9;
  long lVar10;
  uint32_t uVar11;
  bool bVar12;
  
  pPVar2 = as->_physToWorkMap;
  uVar6 = (this->_workRegs).super_ZoneVectorBase._size;
  lVar10 = 0;
  do {
    if ((this->_strategy[lVar10]._type != '\0') &&
       (uVar11 = (pPVar2->assigned)._masks[lVar10], uVar11 != 0)) {
      puVar3 = as->_physToWorkIds[lVar10];
      pvVar4 = (this->_workRegs).super_ZoneVectorBase._data;
      do {
        alignment = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> alignment & 1) == 0; alignment = alignment + 1) {
          }
        }
        if (uVar6 <= puVar3[alignment]) {
          blockEntryAssigned();
          if (alignment < 0x41) {
            out = &this->_temporaryMem;
            uVar6 = (this->_temporaryMem).super_Operand_._signature;
            if (uVar6 == 0) {
              EVar7 = BaseCompiler::_newStack
                                ((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,
                                 (BaseMem *)out,size,alignment,(char *)0x0);
              if (EVar7 != 0) {
                return EVar7;
              }
LAB_0012141f:
              uVar11 = (out->super_Operand_)._baseId;
              uVar8 = (this->_temporaryMem).super_Operand_._data[0];
              uVar5 = (this->_temporaryMem).super_Operand_._data[1];
              (as->_layout).physIndex = (RARegIndex)(out->super_Operand_)._signature;
              (as->_layout).physCount = (RARegCount)uVar11;
              (as->_layout).physTotal = uVar8;
              (as->_layout).workCount = uVar5;
              return 0;
            }
            if ((uVar6 >> 0xd & 1) != 0) {
              uVar11 = (this->_temporaryMem).super_Operand_._baseId;
              this_00 = (BaseCompiler *)(this->super_FuncPass).super_Pass._cb;
              uVar6 = uVar11 - 0x100;
              if (uVar6 < (this_00->_vRegArray).super_ZoneVectorBase._size) {
                lVar10 = *(long *)((long)(this_00->_vRegArray).super_ZoneVectorBase._data +
                                  (ulong)uVar6 * 8);
                uVar6 = *(uint *)(lVar10 + 8);
                uVar8 = size;
                if (size < uVar6) {
                  uVar8 = uVar6;
                }
                uVar6 = (uint)*(byte *)(lVar10 + 0xc);
                if (alignment < uVar6) {
                  alignment = uVar6;
                }
                BaseCompiler::setStackSize(this_00,uVar11,uVar8,alignment);
                goto LAB_0012141f;
              }
              goto LAB_0012144f;
            }
          }
          else {
            useTemporaryMem();
          }
          useTemporaryMem();
LAB_0012144f:
          useTemporaryMem();
          __clang_call_terminate(extraout_RAX);
        }
        uVar9 = 1 << ((byte)alignment & 0x1f);
        puVar1 = (uint *)(*(long *)((long)pvVar4 + (ulong)puVar3[alignment] * 8) + 0x28);
        *puVar1 = *puVar1 | uVar9;
        bVar12 = uVar9 != uVar11;
        uVar11 = uVar11 ^ 1 << (alignment & 0x1f);
      } while (bVar12);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

Error BaseRAPass::blockEntryAssigned(const RAAssignment& as) noexcept {
  // Complex allocation strategy requires to record register assignments upon
  // block entry (or per shared state).
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    if (!_strategy[group].isComplex())
      continue;

    Support::BitWordIterator<uint32_t> it(as.assigned(group));
    while (it.hasNext()) {
      uint32_t physId = it.next();
      uint32_t workId = as.physToWorkId(group, physId);

      RAWorkReg* workReg = workRegById(workId);
      workReg->addAllocatedMask(Support::bitMask(physId));
    }
  }

  return kErrorOk;
}